

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 tcu::sampleLevelArray3DOffset
               (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float s,float t,
               float r,float lod,IVec3 *offset)

{
  int iVar1;
  int iVar2;
  FilterMode filter;
  undefined4 in_register_00000034;
  Sampler *sampler_00;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  ulong uVar4;
  Vector<float,_4> VVar5;
  Vec4 VVar6;
  uint local_bc;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  undefined1 local_88 [8];
  Vec4 t1;
  Vec4 t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  FilterMode levelFilter;
  int level;
  int maxLevel;
  FilterMode filterMode;
  bool magnified;
  IVec3 *offset_local;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  int numLevels_local;
  ConstPixelBufferAccess *levels_local;
  undefined1 auVar7 [12];
  undefined8 uVar8;
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000034,numLevels);
  uVar4 = (ulong)(uint)lod;
  if ((float)offset[1].m_data[2] < lod) {
    local_bc = offset[1].m_data[0];
  }
  else {
    local_bc = offset[1].m_data[1];
  }
  filter = (FilterMode)offset;
  switch(local_bc) {
  case 0:
    VVar5.m_data = (float  [4])
                   ConstPixelBufferAccess::sample3DOffset
                             (levels,sampler_00,filter,s,t,r,(IVec3 *)(ulong)local_bc);
    break;
  case 1:
    VVar5.m_data = (float  [4])
                   ConstPixelBufferAccess::sample3DOffset
                             (levels,sampler_00,filter,s,t,r,(IVec3 *)(ulong)local_bc);
    break;
  case 2:
  case 4:
    fVar3 = ::deFloatCeil(lod + 0.5);
    iVar1 = ::deClamp32((int)fVar3 + -1,0,(int)sampler + -1);
    VVar5.m_data = (float  [4])
                   ConstPixelBufferAccess::sample3DOffset
                             (levels,(Sampler *)(&sampler_00->wrapS + (long)iVar1 * 10),filter,s,t,r
                              ,(IVec3 *)(ulong)(local_bc == 4));
    break;
  case 3:
  case 5:
    iVar1 = (int)sampler + -1;
    fVar3 = ::deFloatFloor(lod);
    iVar2 = ::deClamp32((int)fVar3,0,iVar1);
    iVar1 = de::min<int>(iVar1,iVar2 + 1);
    fVar3 = deFloatFrac(lod);
    ConstPixelBufferAccess::sample3DOffset
              ((ConstPixelBufferAccess *)(t1.m_data + 2),
               (Sampler *)(&sampler_00->wrapS + (long)iVar2 * 10),filter,s,t,r,
               (IVec3 *)(ulong)(uint)(local_bc == 5));
    ConstPixelBufferAccess::sample3DOffset
              ((ConstPixelBufferAccess *)local_88,(Sampler *)(&sampler_00->wrapS + (long)iVar1 * 10)
               ,filter,s,t,r,(IVec3 *)(ulong)(uint)(local_bc == 5));
    operator*((tcu *)&local_98,(Vector<float,_4> *)(t1.m_data + 2),1.0 - fVar3);
    operator*((tcu *)&local_a8,(Vector<float,_4> *)local_88,fVar3);
    VVar5 = operator+((tcu *)levels,&local_98,&local_a8);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)levels,0.0);
    VVar5.m_data[2] = (float)(int)uVar4;
    VVar5.m_data[3] = (float)(int)(uVar4 >> 0x20);
    VVar5.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar5.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar6.m_data[0] = VVar5.m_data[0];
  auVar7._4_4_ = VVar5.m_data[1];
  register0x00001240 = VVar5.m_data[2];
  register0x00001244 = VVar5.m_data[3];
  return (Vec4)VVar6.m_data;
}

Assistant:

Vec4 sampleLevelArray3DOffset (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float s, float t, float r, float lod, const IVec3& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample3DOffset(sampler, filterMode, s, t, r, offset);
		case Sampler::LINEAR:	return levels[0].sample3DOffset(sampler, filterMode, s, t, r, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample3DOffset(sampler, levelFilter, s, t, r, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			tcu::Vec4			t0			= levels[level0].sample3DOffset(sampler, levelFilter, s, t, r, offset);
			tcu::Vec4			t1			= levels[level1].sample3DOffset(sampler, levelFilter, s, t, r, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}